

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O3

void __thiscall higan::Channel::~Channel(Channel *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  p_Var1 = (this->readable_callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->readable_callback_,(_Any_data *)&this->readable_callback_,
              __destroy_functor);
  }
  p_Var1 = (this->writable_callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->writable_callback_,(_Any_data *)&this->writable_callback_,
              __destroy_functor);
  }
  p_Var1 = (this->error_callback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->error_callback_,(_Any_data *)&this->error_callback_,
              __destroy_functor);
  }
  pcVar2 = (this->connection_name_)._M_dataplus._M_p;
  paVar3 = &(this->connection_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Channel::~Channel()
{

}